

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_common2<double>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,TagBase *tagbase,Write<double> *new_data)

{
  Int width;
  Write<double> local_e8;
  Write<double> local_d8;
  Read<int> local_c8;
  Read<double> local_b8;
  Read<double> local_a8 [2];
  Read<int> local_88;
  Write<signed_char> local_78;
  undefined1 local_68 [8];
  Read<double> same_data;
  Read<double> old_data;
  Int ncomps;
  string *name;
  TagBase *tagbase_local;
  LOs *same_ents2new_ents_local;
  LOs *same_ents2old_ents_local;
  Int ent_dim_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  TagBase::name_abi_cxx11_(tagbase);
  width = TagBase::ncomps(tagbase);
  Mesh::get_array<double>
            ((Mesh *)&same_data.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
             (string *)(ulong)(uint)ent_dim);
  Read<int>::Read(&local_88,same_ents2old_ents);
  Read<double>::Read(local_a8,(Read<double> *)&same_data.write_.shared_alloc_.direct_ptr);
  unmap<double>((Omega_h *)&local_78,&local_88,(Read<signed_char> *)local_a8,width);
  read<double>((Omega_h *)local_68,&local_78);
  Write<double>::~Write((Write<double> *)&local_78);
  Read<double>::~Read(local_a8);
  Read<int>::~Read(&local_88);
  Read<double>::Read(&local_b8,(Read<double> *)local_68);
  Read<int>::Read(&local_c8,same_ents2new_ents);
  Write<double>::Write(&local_d8,new_data);
  map_into<double>((Read<signed_char> *)&local_b8,&local_c8,(Write<signed_char> *)&local_d8,width);
  Write<double>::~Write(&local_d8);
  Read<int>::~Read(&local_c8);
  Read<double>::~Read(&local_b8);
  Write<double>::Write(&local_e8,new_data);
  transfer_common3<double>(new_mesh,ent_dim,tagbase,&local_e8);
  Write<double>::~Write(&local_e8);
  Read<double>::~Read((Read<double> *)local_68);
  Read<double>::~Read((Read<double> *)&same_data.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

void transfer_common2(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, TagBase const* tagbase,
    Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  auto old_data = old_mesh->get_array<T>(ent_dim, name);
  auto same_data = read(unmap(same_ents2old_ents, old_data, ncomps));
  map_into(same_data, same_ents2new_ents, new_data, ncomps);
  transfer_common3(new_mesh, ent_dim, tagbase, new_data);
}